

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder_exception.hpp
# Opt level: O3

void __thiscall
duckdb::BinderException::BinderException<unsigned_long>
          (BinderException *this,string *msg,unsigned_long params)

{
  string local_30;
  
  Exception::ConstructMessage<unsigned_long>(&local_30,msg,params);
  BinderException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit BinderException(const string &msg, ARGS... params) : BinderException(ConstructMessage(msg, params...)) {
	}